

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O1

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryPage::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryPage *this,VkDeviceSize size,
          VkDeviceSize alignment)

{
  int iVar1;
  OffsetType OVar2;
  char (*Args_1) [126];
  char (*in_R8) [23];
  Allocation AVar3;
  string msg;
  string local_58;
  VkDeviceSize local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar1 == 0) {
    AVar3 = Diligent::VariableSizeAllocationsManager::Allocate
                      (&this->m_AllocationMgr,size,alignment);
    OVar2 = AVar3.UnalignedOffset;
    if (OVar2 == 0xffffffffffffffff) {
      __return_storage_ptr__->Page = (VulkanMemoryPage *)0x0;
      __return_storage_ptr__->UnalignedOffset = 0;
      __return_storage_ptr__->Size = 0;
    }
    else {
      local_38 = alignment;
      if ((alignment ^ alignment - 1) <= alignment - 1) {
        Diligent::FormatString<char[12],unsigned_long,char[23]>
                  (&local_58,(Diligent *)"Alignment (",(char (*) [12])&local_38,
                   (unsigned_long *)") must be a power of 2",in_R8);
        Diligent::DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      Args_1 = (char (*) [126])(OVar2 + local_38 + -1);
      if (AVar3.Size < ((-local_38 & (ulong)Args_1) - OVar2) + size) {
        Diligent::FormatString<char[26],char[126]>
                  (&local_58,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size"
                   ,Args_1);
        Diligent::DebugAssertionFailed
                  (local_58._M_dataplus._M_p,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                   ,0x6e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      __return_storage_ptr__->Page = this;
      __return_storage_ptr__->UnalignedOffset = AVar3.UnalignedOffset;
      __return_storage_ptr__->Size = AVar3.Size;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

VulkanMemoryAllocation VulkanMemoryPage::Allocate(VkDeviceSize size, VkDeviceSize alignment)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    VERIFY(size <= std::numeric_limits<AllocationsMgrOffsetType>::max(),
           "Allocation size (", size, ") exceeds maximum allowed value ",
           std::numeric_limits<AllocationsMgrOffsetType>::max());
    auto Allocation = m_AllocationMgr.Allocate(static_cast<AllocationsMgrOffsetType>(size), static_cast<AllocationsMgrOffsetType>(alignment));
    if (Allocation.IsValid())
    {
        // Offset may not necessarily be aligned, but the allocation is guaranteed to be large enough
        // to accommodate requested alignment
        VERIFY_EXPR(Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size);
        return VulkanMemoryAllocation{this, Allocation.UnalignedOffset, Allocation.Size};
    }
    else
    {
        return VulkanMemoryAllocation{};
    }
}